

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void Excel::Parser::handleLabel(Record *record,size_t sheetIdx,IStorage *storage)

{
  RecordSubstream *this;
  BiffVersion in_R9D;
  int16_t row;
  int16_t column;
  size_t local_58;
  wstring data;
  
  row = 0;
  column = 0;
  this = &record->m_stream;
  local_58 = sheetIdx;
  Stream::read<short>(&this->super_Stream,&row,2);
  Stream::read<short>(&this->super_Stream,&column,2);
  (*(record->m_stream).super_Stream._vptr_Stream[4])(this,2,1);
  loadString_abi_cxx11_
            (&data,(Excel *)this,(Stream *)&record->m_borders,
             (vector<int,_std::allocator<int>_> *)0x2,0x500,in_R9D);
  (*storage->_vptr_IStorage[6])(storage,local_58,(long)row,(long)column,&data);
  std::__cxx11::wstring::~wstring((wstring *)&data);
  return;
}

Assistant:

inline void
Parser::handleLabel( Record & record, size_t sheetIdx, IStorage & storage )
{
	int16_t row = 0;
	int16_t column = 0;

	record.dataStream().read( row, 2 );
	record.dataStream().read( column, 2 );
	record.dataStream().seek( 2, Excel::Stream::FromCurrent );
	const auto data = loadString( record.dataStream(), record.borders(), 2, BOF::BIFF7 );

	storage.onCell( sheetIdx, row, column, data );
}